

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnBrTableExpr
          (BinaryReaderInterp *this,Index num_targets,Index *target_depths,
          Index default_target_depth)

{
  Index index;
  Index depth;
  Result RVar1;
  Enum EVar2;
  ulong uVar3;
  Index keep_count;
  Index drop_count;
  u32 local_10c;
  u32 local_108;
  Index local_104;
  SharedValidator *local_100;
  ulong local_f8;
  Index *local_f0;
  Location local_e8;
  Var local_c0;
  Var local_78;
  
  local_100 = &this->validator_;
  local_f0 = target_depths;
  RVar1 = SharedValidator::BeginBrTable
                    (local_100,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    local_104 = default_target_depth;
    Istream::Emit(this->istream_,BrTable,num_targets);
    if (num_targets != 0) {
      uVar3 = 0;
      local_f8 = (ulong)num_targets;
      do {
        index = local_f0[uVar3];
        local_e8.field_1.field_0.line = 0;
        local_e8.field_1._4_8_ = 0;
        local_e8.filename.data_ = (char *)0x0;
        local_e8.filename.size_._0_4_ = 0;
        local_e8.filename.size_._4_4_ = 0;
        Var::Var(&local_78,index,&local_e8);
        RVar1 = SharedValidator::OnBrTableTarget
                          (local_100,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                           &local_78);
        Var::~Var(&local_78);
        if (RVar1.enum_ == Error) {
          return (Result)Error;
        }
        RVar1 = GetBrDropKeepCount(this,index,&local_108,&local_10c);
        if (RVar1.enum_ == Error) {
          return (Result)Error;
        }
        Istream::Emit(this->istream_,InterpDropKeep,local_108,local_10c);
        EmitBr(this,index,0,0);
        uVar3 = uVar3 + 1;
      } while (local_f8 != uVar3);
    }
    depth = local_104;
    local_e8.field_1.field_0.line = 0;
    local_e8.field_1._4_8_ = 0;
    local_e8.filename.data_ = (char *)0x0;
    local_e8.filename.size_._0_4_ = 0;
    local_e8.filename.size_._4_4_ = 0;
    Var::Var(&local_c0,local_104,&local_e8);
    RVar1 = SharedValidator::OnBrTableTarget
                      (local_100,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                       &local_c0);
    Var::~Var(&local_c0);
    EVar2 = Error;
    if ((RVar1.enum_ != Error) &&
       (RVar1 = GetBrDropKeepCount(this,depth,&local_108,&local_10c), RVar1.enum_ != Error)) {
      Istream::EmitDropKeep(this->istream_,local_108,local_10c);
      EmitBr(this,local_104,0,0);
      RVar1 = SharedValidator::EndBrTable
                        (local_100,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc);
      EVar2 = (Enum)(RVar1.enum_ == Error);
    }
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderInterp::OnBrTableExpr(Index num_targets,
                                         Index* target_depths,
                                         Index default_target_depth) {
  CHECK_RESULT(validator_.BeginBrTable(loc));
  Index drop_count, keep_count;
  istream_.Emit(Opcode::BrTable, num_targets);

  for (Index i = 0; i < num_targets; ++i) {
    Index depth = target_depths[i];
    CHECK_RESULT(validator_.OnBrTableTarget(loc, Var(depth)));
    CHECK_RESULT(GetBrDropKeepCount(depth, &drop_count, &keep_count));
    // Emit DropKeep directly (instead of using EmitDropKeep) so the
    // instruction has a fixed size.
    istream_.Emit(Opcode::InterpDropKeep, drop_count, keep_count);
    EmitBr(depth, 0, 0);
  }
  CHECK_RESULT(validator_.OnBrTableTarget(loc, Var(default_target_depth)));
  CHECK_RESULT(
      GetBrDropKeepCount(default_target_depth, &drop_count, &keep_count));
  // The default case doesn't need a fixed size, since it is never jumped over.
  istream_.EmitDropKeep(drop_count, keep_count);
  EmitBr(default_target_depth, 0, 0);

  CHECK_RESULT(validator_.EndBrTable(loc));
  return Result::Ok;
}